

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example1.cpp
# Opt level: O2

void use_file_contents_proc(Am_Object *command,Am_Value_List *contents)

{
  Am_Value *pAVar1;
  char cVar2;
  Am_Object item;
  Am_Object created_objs;
  Am_Value_List current;
  Am_Object local_30;
  
  Am_Object::Get_Object((ushort)&item,(ulong)command);
  Am_Object::Get_Object((ushort)&current,(ulong)&item);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&current,(ulong)CREATED_OBJS);
  Am_Object::Am_Object(&created_objs,pAVar1);
  Am_Object::~Am_Object((Am_Object *)&current);
  Am_Object::~Am_Object(&item);
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)&created_objs,0x82);
  Am_Value_List::Am_Value_List(&current,pAVar1);
  item.data = (Am_Object_Data *)0x0;
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar1 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&item,pAVar1);
    Am_Object::Destroy();
    Am_Value_List::Next();
  }
  Am_Value_List::Start();
  while( true ) {
    cVar2 = Am_Value_List::Last();
    if (cVar2 != '\0') break;
    pAVar1 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&item,pAVar1);
    Am_Object::Am_Object(&local_30,&item);
    Am_Object::Add_Part((Am_Object_Data *)&created_objs,SUB81(&local_30,0),1);
    Am_Object::~Am_Object(&local_30);
    Am_Value_List::Next();
  }
  Am_Object::~Am_Object(&item);
  Am_Value_List::~Am_Value_List(&current);
  Am_Object::~Am_Object(&created_objs);
  return;
}

Assistant:

Am_Define_Method (Am_Handle_Loaded_Items_Method, void, use_file_contents,
		  (Am_Object command, Am_Value_List &contents)) {
  //Get the group to put the created object into.  Every command will
  //have a Am_SAVED_OLD_OWNER which is set with the widget or
  //interactor the command is attached to.  Get the CREATED_OBJS group
  //out of that widget's window.
  Am_Object created_objs = command.Get_Object(Am_SAVED_OLD_OWNER)
    .Get_Object(Am_WINDOW).Get(CREATED_OBJS);
  Am_Value_List current = created_objs.Get (Am_GRAPHICAL_PARTS);
  Am_Object item;
  //first delete all of the current contents of the window
  for (current.Start (); !current.Last (); current.Next ()) {
    item = current.Get ();
    item.Destroy ();
  }
  //now add the new objects
  for (contents.Start (); !contents.Last (); contents.Next ()) {
    item = contents.Get ();
    created_objs.Add_Part (item);
  }
}